

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

string * __thiscall
vkt::synchronization::getResourceName_abi_cxx11_
          (string *__return_storage_ptr__,synchronization *this,ResourceDescription *resource)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  allocator<char> local_291;
  string local_290;
  string local_270;
  string local_250 [33];
  byte local_22f;
  allocator<char> local_22e;
  byte local_22d;
  int local_22c;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  byte local_1e7;
  allocator<char> local_1e6;
  byte local_1e5;
  int local_1e4;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream local_190 [8];
  ostringstream str;
  ResourceDescription *resource_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (*(int *)this == 0) {
    poVar3 = std::operator<<((ostream *)local_190,"buffer_");
    iVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(this + 4));
    std::ostream::operator<<(poVar3,iVar2);
  }
  else if (*(int *)this == 1) {
    poVar3 = std::operator<<((ostream *)local_190,"image_");
    iVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(this + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    local_1e5 = 0;
    local_1e7 = 0;
    iVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(this + 4));
    if (iVar2 < 1) {
      std::allocator<char>::allocator();
      local_1e7 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1e6);
    }
    else {
      local_1e4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(this + 4));
      de::toString<int>(&local_1e0,&local_1e4);
      local_1e5 = 1;
      std::operator+(&local_1c0,"x",&local_1e0);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
    local_22d = 0;
    local_22f = 0;
    iVar2 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(this + 4));
    if (iVar2 < 1) {
      std::allocator<char>::allocator();
      local_22f = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_22e);
    }
    else {
      local_22c = tcu::Vector<int,_4>::z((Vector<int,_4> *)(this + 4));
      de::toString<int>(&local_228,&local_22c);
      local_22d = 1;
      std::operator+(&local_208,"x",&local_228);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_208);
    poVar3 = std::operator<<(poVar3,"_");
    __s = ::vk::getFormatName(*(VkFormat *)(this + 0x18));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,__s,&local_291);
    de::toLower(&local_270,&local_290);
    std::__cxx11::string::substr((ulong)local_250,(ulong)&local_270);
    std::operator<<(poVar3,local_250);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_208);
    if ((local_22f & 1) != 0) {
      std::allocator<char>::~allocator(&local_22e);
    }
    if ((local_22d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_228);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    if ((local_1e7 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1e6);
    }
    if ((local_1e5 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1e0);
    }
  }
  else {
    bVar1 = isIndirectBuffer(*(ResourceType *)this);
    if (bVar1) {
      std::operator<<((ostream *)local_190,"indirect_buffer");
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getResourceName (const ResourceDescription& resource)
{
	std::ostringstream str;

	if (resource.type == RESOURCE_TYPE_BUFFER)
		str << "buffer_" << resource.size.x();
	else if (resource.type == RESOURCE_TYPE_IMAGE)
	{
		str << "image_" << resource.size.x()
						<< (resource.size.y() > 0 ? "x" + de::toString(resource.size.y()) : "")
						<< (resource.size.z() > 0 ? "x" + de::toString(resource.size.z()) : "")
			<< "_" << de::toLower(getFormatName(resource.imageFormat)).substr(10);
	}
	else if (isIndirectBuffer(resource.type))
		str << "indirect_buffer";
	else
		DE_ASSERT(0);

	return str.str();
}